

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O3

bool cmQtAutoGenerator::MakeParentDirectory(string *filename)

{
  Status SVar1;
  bool bVar2;
  string dirName;
  string local_28;
  
  cmsys::SystemTools::GetFilenamePath(&local_28,filename);
  if (local_28._M_string_length == 0) {
    bVar2 = true;
  }
  else {
    SVar1 = cmsys::SystemTools::MakeDirectory(&local_28,(mode_t *)0x0);
    bVar2 = SVar1.Kind_ == Success;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGenerator::MakeParentDirectory(std::string const& filename)
{
  bool success = true;
  std::string const dirName = cmSystemTools::GetFilenamePath(filename);
  if (!dirName.empty()) {
    success = static_cast<bool>(cmSystemTools::MakeDirectory(dirName));
  }
  return success;
}